

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O0

void __thiscall ConsoleTable::setStyle(ConsoleTable *this,uint n)

{
  uint n_local;
  ConsoleTable *this_local;
  
  switch(n) {
  case 0:
    TableStyle::operator=(&this->style,&this->BasicStyle);
    break;
  case 1:
    TableStyle::operator=(&this->style,&this->LineStyle);
    break;
  case 2:
    TableStyle::operator=(&this->style,&this->DoubleLineStyle);
    break;
  case 3:
    TableStyle::operator=(&this->style,&this->InvisibleStyle);
    break;
  default:
    TableStyle::operator=(&this->style,&this->BasicStyle);
  }
  return;
}

Assistant:

void ConsoleTable::setStyle(unsigned int n) {
    switch (n) {
        case 0 :
            style = BasicStyle;
            break;
        case 1 :
            style = LineStyle;
            break;
        case 2 :
            style = DoubleLineStyle;
            break;
        case 3 :
            style = InvisibleStyle;
            break;
        default :
            style = BasicStyle;
            break;
    }
}